

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262_slice.c
# Opt level: O2

int h262_slice(bitstream *str,h262_seqparm *seqparm,h262_picparm *picparm,h262_slice *slice)

{
  undefined8 *puVar1;
  h262_macroblock *phVar2;
  h262_picparm *picparm_00;
  int iVar3;
  uint uVar4;
  uint32_t uVar5;
  ulong uVar6;
  h262_seqparm *seqparm_00;
  char *__ptr;
  undefined1 auVar7 [4];
  long lVar8;
  bool bVar9;
  size_t sStack_60;
  undefined1 local_4c [4];
  uint32_t qsc;
  uint32_t tmp;
  h262_picparm *local_40;
  h262_seqparm *local_38;
  
  iVar3 = vs_u(str,&slice->quantiser_scale_code,5);
  if (iVar3 == 0) {
    local_38 = seqparm;
    iVar3 = vs_u(str,&slice->intra_slice_flag,1);
    if (iVar3 == 0) {
      if (slice->intra_slice_flag == 0) {
LAB_00104c2c:
        local_4c = (undefined1  [4])(slice->first_mb_in_slice % picparm->pic_width_in_mbs);
        iVar3 = h262_mb_addr_inc(str,(uint32_t *)local_4c);
        if (iVar3 == 0) {
          if ((uint)local_4c < picparm->pic_width_in_mbs) {
            uVar4 = picparm->pic_width_in_mbs * slice->slice_vertical_position + (int)local_4c;
            uVar6 = (ulong)uVar4;
            slice->first_mb_in_slice = uVar4;
            qsc = slice->quantiser_scale_code;
            local_40 = picparm;
            do {
              while( true ) {
                uVar5 = (uint32_t)uVar6;
                iVar3 = h262_macroblock(str,local_38,picparm,slice->mbs + (uVar6 & 0xffffffff),&qsc)
                ;
                if (iVar3 != 0) {
                  return 1;
                }
                if (str->dir != VS_DECODE) break;
                slice->last_mb_in_slice = uVar5;
                iVar3 = vs_has_more_data(str);
                if (iVar3 == 0) {
                  return 0;
                }
                seqparm_00 = (h262_seqparm *)local_4c;
                iVar3 = h262_mb_addr_inc(str,(uint32_t *)seqparm_00);
                if (iVar3 != 0) {
                  return 1;
                }
                if (picparm->pic_size_in_mbs <= uVar5 + 1) {
LAB_00104e28:
                  __ptr = "MB index overflow\n";
                  sStack_60 = 0x12;
LAB_00104e3b:
                  fwrite(__ptr,sStack_60,1,_stderr);
                  return 1;
                }
                uVar6 = (ulong)(uVar5 + 1);
                lVar8 = uVar6 * 0xc84;
                auVar7 = local_4c;
                while (picparm_00 = local_40, bVar9 = auVar7 != (undefined1  [4])0x0,
                      auVar7 = (undefined1  [4])((int)auVar7 - 1), bVar9) {
                  phVar2 = slice->mbs;
                  *(undefined4 *)
                   ((long)&((h262_macroblock *)(phVar2->motion_vertical_field_select + -5))->
                           macroblock_skipped + lVar8) = 1;
                  puVar1 = (undefined8 *)
                           ((long)((h262_macroblock *)
                                  (((h262_macroblock *)
                                   (((h262_macroblock *)(phVar2->motion_vertical_field_select + -5))
                                    ->motion_vertical_field_select + -5))->
                                   motion_vertical_field_select + -5))->motion_vertical_field_select
                           + lVar8 + 0xffffffffffffffdcU);
                  *puVar1 = 0;
                  puVar1[1] = 0;
                  *(undefined4 *)((long)(phVar2->motion_vertical_field_select + -3) + lVar8 + 4) = 0
                  ;
                  iVar3 = h262_infer_vectors(str,seqparm_00,local_40,
                                             (h262_macroblock *)
                                             ((long)&((h262_macroblock *)
                                                     (phVar2->motion_vertical_field_select + -5))->
                                                     macroblock_skipped + lVar8),0);
                  if (iVar3 != 0) {
                    return 1;
                  }
                  iVar3 = h262_infer_vectors(str,seqparm_00,picparm_00,
                                             (h262_macroblock *)
                                             ((long)&((h262_macroblock *)
                                                     (slice->mbs->motion_vertical_field_select + -5)
                                                     )->macroblock_skipped + lVar8),1);
                  if (iVar3 != 0) {
                    return 1;
                  }
                  uVar6 = uVar6 + 1;
                  lVar8 = lVar8 + 0xc84;
                  if (picparm_00->pic_size_in_mbs <= uVar6) goto LAB_00104e28;
                }
                local_4c = (undefined1  [4])0x0;
                picparm = local_40;
              }
              if (slice->last_mb_in_slice == uVar5) {
                return 0;
              }
              uVar4 = 0;
              while( true ) {
                if ((uVar5 - slice->last_mb_in_slice) + uVar4 == 0) {
                  __ptr = "Last MB in slice is skipped\n";
                  sStack_60 = 0x1c;
                  goto LAB_00104e3b;
                }
                if (slice->mbs[uVar4 + uVar5].macroblock_skipped == 0) break;
                uVar4 = uVar4 + 1;
              }
              local_4c = (undefined1  [4])uVar4;
              iVar3 = h262_mb_addr_inc(str,(uint32_t *)local_4c);
              uVar6 = (ulong)(uVar4 + uVar5);
            } while (iVar3 == 0);
          }
          else {
            fwrite("Initial mb_addr_inc too large\n",0x1e,1,_stderr);
          }
        }
      }
      else {
        iVar3 = vs_u(str,&slice->intra_slice,1);
        if (iVar3 == 0) {
          tmp = 0;
          iVar3 = vs_u(str,&tmp,8);
          if (iVar3 == 0) {
            do {
              if ((tmp & 1) == 0) goto LAB_00104c2c;
              iVar3 = vs_u(str,&tmp,9);
            } while (iVar3 == 0);
          }
        }
      }
    }
  }
  return 1;
}

Assistant:

int h262_slice(struct bitstream *str, struct h262_seqparm *seqparm, struct h262_picparm *picparm, struct h262_slice *slice) {
	if (vs_u(str, &slice->quantiser_scale_code, 5))
		return 1;
	if (vs_u(str, &slice->intra_slice_flag, 1)) return 1;
	if (slice->intra_slice_flag) {
		if (vs_u(str, &slice->intra_slice, 1)) return 1;
		uint32_t tmp = 0;
		if (vs_u(str, &tmp, 8)) return 1;
		while(tmp & 1) {
			if (vs_u(str, &tmp, 9)) return 1;
		}
	}
	uint32_t tmp = slice->first_mb_in_slice % picparm->pic_width_in_mbs;
	if (h262_mb_addr_inc(str, &tmp)) return 1;
	if (tmp >= picparm->pic_width_in_mbs) {
		fprintf(stderr, "Initial mb_addr_inc too large\n");
		return 1;
	}
	slice->first_mb_in_slice = slice->slice_vertical_position * picparm->pic_width_in_mbs + tmp;
	uint32_t qsc = slice->quantiser_scale_code;
	uint32_t curr_mb_addr = slice->first_mb_in_slice;
	while (1) {
		if (h262_macroblock(str, seqparm, picparm, &slice->mbs[curr_mb_addr], &qsc)) return 1;
		if (str->dir == VS_DECODE) {
			slice->last_mb_in_slice = curr_mb_addr;
			curr_mb_addr++;
			if (!vs_has_more_data(str))
				return 0;
			if (h262_mb_addr_inc(str, &tmp)) return 1;
			if (curr_mb_addr >= picparm->pic_size_in_mbs) {
				fprintf(stderr, "MB index overflow\n");
				return 1;
			}
			while (tmp) {
				slice->mbs[curr_mb_addr].macroblock_skipped = 1;
				slice->mbs[curr_mb_addr].macroblock_quant = 0;
				slice->mbs[curr_mb_addr].macroblock_motion_forward = 0;
				slice->mbs[curr_mb_addr].macroblock_motion_backward = 0;
				slice->mbs[curr_mb_addr].macroblock_pattern = 0;
				slice->mbs[curr_mb_addr].macroblock_intra = 0;
				if (h262_infer_vectors(str, seqparm, picparm, &slice->mbs[curr_mb_addr], 0)) return 1;
				if (h262_infer_vectors(str, seqparm, picparm, &slice->mbs[curr_mb_addr], 1)) return 1;
				curr_mb_addr++;
				if (curr_mb_addr >= picparm->pic_size_in_mbs) {
					fprintf(stderr, "MB index overflow\n");
					return 1;
				}
				tmp--;
			}
		} else {
			if (slice->last_mb_in_slice == curr_mb_addr) {
				return 0;
			}
			tmp = 0;
			while (slice->last_mb_in_slice != curr_mb_addr && slice->mbs[curr_mb_addr].macroblock_skipped) {
				tmp++;
				curr_mb_addr++;
			}
			if (slice->last_mb_in_slice == curr_mb_addr) {
				fprintf(stderr, "Last MB in slice is skipped\n");
				return 1;
			}
			if (h262_mb_addr_inc(str, &tmp)) return 1;
		}
	}
	return 0;
}